

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1ee485::LineEdit::~LineEdit(LineEdit *this)

{
  LineEdit *in_RDI;
  
  ~LineEdit(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

Q_OBJECT
public:
    LineEdit(QWidget* parent = nullptr)
        : QLineEdit(parent)
    {
        setContextMenuPolicy(Qt::NoContextMenu);
        connect(this, &LineEdit::returnPressed, this, &LineEdit::handleReturnPressed);
    }